

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

QPDFMatrix * __thiscall
QPDFPageObjectHelper::getMatrixForFormXObjectPlacement
          (QPDFMatrix *__return_storage_ptr__,QPDFPageObjectHelper *this,QPDFObjectHandle *fo,
          Rectangle rect,bool invert_transformations,bool allow_shrink,bool allow_expand)

{
  Rectangle r;
  Rectangle r_00;
  bool bVar1;
  double local_3e0;
  double ty;
  double tx;
  double r_cy;
  double r_cx;
  double t_cy;
  double t_cx;
  Rectangle local_320;
  QPDFMatrix local_300;
  double local_2d0;
  double scale;
  double yscale;
  double xscale;
  double t_h;
  double t_w;
  double rect_h;
  double rect_w;
  double dStack_290;
  double local_288;
  double dStack_280;
  undefined1 auStack_278 [8];
  Rectangle T;
  Rectangle bbox;
  string local_230 [32];
  QPDFObjectHandle local_210;
  Matrix local_200;
  QPDFMatrix local_1d0;
  allocator<char> local_199;
  string local_198 [32];
  QPDFObjectHandle local_178;
  Matrix local_168;
  QPDFMatrix local_138;
  undefined1 auStack_108 [8];
  QPDFMatrix fmatrix;
  QPDFMatrix tmatrix;
  QPDFMatrix wmatrix;
  allocator<char> local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  QPDFObjectHandle bbox_obj;
  QPDFObjectHandle fdict;
  bool allow_expand_local;
  bool allow_shrink_local;
  bool invert_transformations_local;
  QPDFObjectHandle *fo_local;
  QPDFPageObjectHelper *this_local;
  
  QPDFObjectHandle::getDict
            ((QPDFObjectHandle *)
             &bbox_obj.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"/BBox",&local_61);
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)local_40,
             (string *)
             &bbox_obj.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  bVar1 = QPDFObjectHandle::isRectangle((QPDFObjectHandle *)local_40);
  if (bVar1) {
    QPDFMatrix::QPDFMatrix((QPDFMatrix *)&tmatrix.f);
    QPDFMatrix::QPDFMatrix((QPDFMatrix *)&fmatrix.f);
    QPDFMatrix::QPDFMatrix((QPDFMatrix *)auStack_108);
    if (invert_transformations) {
      getMatrixForTransformations(&local_168,this,true);
      QPDFMatrix::QPDFMatrix(&local_138,&local_168);
      tmatrix.d = local_138.e;
      tmatrix.e = local_138.f;
      tmatrix.b = local_138.c;
      tmatrix.c = local_138.d;
      fmatrix.f = local_138.a;
      tmatrix.a = local_138.b;
      QPDFMatrix::concat((QPDFMatrix *)&tmatrix.f,(QPDFMatrix *)&fmatrix.f);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_198,"/Matrix",&local_199);
    QPDFObjectHandle::getKey
              (&local_178,
               (string *)
               &bbox_obj.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    bVar1 = QPDFObjectHandle::isMatrix(&local_178);
    QPDFObjectHandle::~QPDFObjectHandle(&local_178);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator(&local_199);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_230,"/Matrix",(allocator<char> *)((long)&bbox.ury + 7));
      QPDFObjectHandle::getKey
                (&local_210,
                 (string *)
                 &bbox_obj.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::getArrayAsMatrix(&local_200,&local_210);
      QPDFMatrix::QPDFMatrix(&local_1d0,&local_200);
      fmatrix.d = local_1d0.e;
      fmatrix.e = local_1d0.f;
      fmatrix.b = local_1d0.c;
      fmatrix.c = local_1d0.d;
      auStack_108 = (undefined1  [8])local_1d0.a;
      fmatrix.a = local_1d0.b;
      QPDFObjectHandle::~QPDFObjectHandle(&local_210);
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator((allocator<char> *)((long)&bbox.ury + 7));
      QPDFMatrix::concat((QPDFMatrix *)&tmatrix.f,(QPDFMatrix *)auStack_108);
    }
    QPDFObjectHandle::getArrayAsRectangle((Rectangle *)&T.ury,(QPDFObjectHandle *)local_40);
    local_288 = bbox.lly;
    dStack_280 = bbox.urx;
    rect_w = T.ury;
    dStack_290 = bbox.llx;
    r.lly = bbox.llx;
    r.llx = T.ury;
    r.urx = bbox.lly;
    r.ury = bbox.urx;
    QPDFMatrix::transformRectangle((Rectangle *)auStack_278,(QPDFMatrix *)&tmatrix.f,r);
    if (((T.lly == (double)auStack_278) && (!NAN(T.lly) && !NAN((double)auStack_278))) ||
       ((T.urx == T.llx && (!NAN(T.urx) && !NAN(T.llx))))) {
      QPDFMatrix::QPDFMatrix(__return_storage_ptr__);
    }
    else {
      rect_h = rect.urx - rect.llx;
      t_w = rect.ury - rect.lly;
      t_h = T.lly - (double)auStack_278;
      xscale = T.urx - T.llx;
      yscale = rect_h / t_h;
      scale = t_w / xscale;
      local_3e0 = scale;
      if (yscale < scale) {
        local_3e0 = yscale;
      }
      local_2d0 = local_3e0;
      if (local_3e0 <= 1.0) {
        if ((local_3e0 < 1.0) && (!allow_shrink)) {
          local_2d0 = 1.0;
        }
      }
      else if (!allow_expand) {
        local_2d0 = 1.0;
      }
      QPDFMatrix::QPDFMatrix(&local_300);
      tmatrix.f = local_300.a;
      QPDFMatrix::scale((QPDFMatrix *)&tmatrix.f,local_2d0,local_2d0);
      QPDFMatrix::concat((QPDFMatrix *)&tmatrix.f,(QPDFMatrix *)&fmatrix.f);
      QPDFMatrix::concat((QPDFMatrix *)&tmatrix.f,(QPDFMatrix *)auStack_108);
      r_00.lly = bbox.llx;
      r_00.llx = T.ury;
      r_00.urx = bbox.lly;
      r_00.ury = bbox.urx;
      QPDFMatrix::transformRectangle(&local_320,(QPDFMatrix *)&tmatrix.f,r_00);
      T.lly = local_320.urx;
      T.urx = local_320.ury;
      auStack_278 = (undefined1  [8])local_320.llx;
      T.llx = local_320.lly;
      QPDFMatrix::QPDFMatrix(__return_storage_ptr__);
      QPDFMatrix::translate
                (__return_storage_ptr__,
                 (rect.llx + rect.urx) * 0.5 - (local_320.llx + local_320.urx) * 0.5,
                 (rect.lly + rect.ury) * 0.5 - (local_320.lly + local_320.ury) * 0.5);
      QPDFMatrix::scale(__return_storage_ptr__,local_2d0,local_2d0);
      QPDFMatrix::concat(__return_storage_ptr__,(QPDFMatrix *)&fmatrix.f);
    }
  }
  else {
    QPDFMatrix::QPDFMatrix(__return_storage_ptr__);
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_40);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &bbox_obj.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

QPDFMatrix
QPDFPageObjectHelper::getMatrixForFormXObjectPlacement(
    QPDFObjectHandle fo,
    QPDFObjectHandle::Rectangle rect,
    bool invert_transformations,
    bool allow_shrink,
    bool allow_expand)
{
    // Calculate the transformation matrix that will place the given form XObject fully inside the
    // given rectangle, center and shrinking or expanding as needed if requested.

    // When rendering a form XObject, the transformation in the graphics state (cm) is applied first
    // (of course -- when it is applied, the PDF interpreter doesn't even know we're going to be
    // drawing a form XObject yet), and then the object's matrix (M) is applied. The resulting
    // matrix, when applied to the form XObject's bounding box, will generate a new rectangle. We
    // want to create a transformation matrix that make the form XObject's bounding box land in
    // exactly the right spot.

    QPDFObjectHandle fdict = fo.getDict();
    QPDFObjectHandle bbox_obj = fdict.getKey("/BBox");
    if (!bbox_obj.isRectangle()) {
        return {};
    }

    QPDFMatrix wmatrix; // work matrix
    QPDFMatrix tmatrix; // "to" matrix
    QPDFMatrix fmatrix; // "from" matrix
    if (invert_transformations) {
        // tmatrix inverts scaling and rotation of the destination page. Applying this matrix allows
        // the overlaid form XObject's to be absolute rather than relative to properties of the
        // destination page. tmatrix is part of the computed transformation matrix.
        tmatrix = QPDFMatrix(getMatrixForTransformations(true));
        wmatrix.concat(tmatrix);
    }
    if (fdict.getKey("/Matrix").isMatrix()) {
        // fmatrix is the transformation matrix that is applied to the form XObject itself. We need
        // this for calculations, but we don't explicitly use it in the final result because the PDF
        // rendering system automatically applies this last before
        // drawing the form XObject.
        fmatrix = QPDFMatrix(fdict.getKey("/Matrix").getArrayAsMatrix());
        wmatrix.concat(fmatrix);
    }

    // The current wmatrix handles transformation from the form xobject and, if requested, the
    // destination page. Next, we have to adjust this for scale and position.

    // Step 1: figure out what scale factor we need to make the form XObject's bounding box fit
    // within the destination rectangle.

    // Transform bounding box
    QPDFObjectHandle::Rectangle bbox = bbox_obj.getArrayAsRectangle();
    QPDFObjectHandle::Rectangle T = wmatrix.transformRectangle(bbox);

    // Calculate a scale factor, if needed. Shrink or expand if needed and allowed.
    if ((T.urx == T.llx) || (T.ury == T.lly)) {
        // avoid division by zero
        return {};
    }
    double rect_w = rect.urx - rect.llx;
    double rect_h = rect.ury - rect.lly;
    double t_w = T.urx - T.llx;
    double t_h = T.ury - T.lly;
    double xscale = rect_w / t_w;
    double yscale = rect_h / t_h;
    double scale = (xscale < yscale ? xscale : yscale);
    if (scale > 1.0) {
        if (!allow_expand) {
            scale = 1.0;
        }
    } else if (scale < 1.0) {
        if (!allow_shrink) {
            scale = 1.0;
        }
    }

    // Step 2: figure out what translation is required to get the rectangle to the right spot:
    // centered within the destination.
    wmatrix = QPDFMatrix();
    wmatrix.scale(scale, scale);
    wmatrix.concat(tmatrix);
    wmatrix.concat(fmatrix);

    T = wmatrix.transformRectangle(bbox);
    double t_cx = (T.llx + T.urx) / 2.0;
    double t_cy = (T.lly + T.ury) / 2.0;
    double r_cx = (rect.llx + rect.urx) / 2.0;
    double r_cy = (rect.lly + rect.ury) / 2.0;
    double tx = r_cx - t_cx;
    double ty = r_cy - t_cy;

    // Now we can calculate the final matrix. The final matrix does not include fmatrix because that
    // is applied automatically by the PDF interpreter.
    QPDFMatrix cm;
    cm.translate(tx, ty);
    cm.scale(scale, scale);
    cm.concat(tmatrix);
    return cm;
}